

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  int iVar1;
  ImGuiTabItem *tab;
  undefined1 local_60 [8];
  ImGuiTabItem item_tmp;
  ImGuiTabItem *tab2;
  int tab2_order;
  ImGuiTabItem *tab1;
  ImGuiTabBar *tab_bar_local;
  
  tab = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
  if ((tab == (ImGuiTabItem *)0x0) || ((tab->Flags & 0x20U) != 0)) {
    tab_bar_local._7_1_ = false;
  }
  else {
    iVar1 = ImGuiTabBar::GetTabOrder(tab_bar,tab);
    iVar1 = iVar1 + tab_bar->ReorderRequestDir;
    if ((iVar1 < 0) || ((tab_bar->Tabs).Size <= iVar1)) {
      tab_bar_local._7_1_ = false;
    }
    else {
      item_tmp._40_8_ = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar1);
      if ((((ImGuiTabItem *)item_tmp._40_8_)->Flags & 0x20U) == 0) {
        if ((tab->Flags & 0xc0U) == (((ImGuiTabItem *)item_tmp._40_8_)->Flags & 0xc0U)) {
          memcpy(local_60,tab,0x30);
          memcpy(tab,(void *)item_tmp._40_8_,0x2b);
          memcpy((void *)item_tmp._40_8_,local_60,0x2b);
          if ((tab_bar->Flags & 0x400000U) != 0) {
            MarkIniSettingsDirty();
          }
          tab_bar_local._7_1_ = true;
        }
        else {
          tab_bar_local._7_1_ = false;
        }
      }
      else {
        tab_bar_local._7_1_ = false;
      }
    }
  }
  return tab_bar_local._7_1_;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered TabItem must share the same position flags than target
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (tab2->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    *tab1 = *tab2;
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}